

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::UnaryExpr<_duckdb_value_*const_&>::streamReconstructedExpression
          (UnaryExpr<_duckdb_value_*const_&> *this,ostream *os)

{
  _duckdb_value **in_RDX;
  string local_30;
  
  Detail::stringify<_duckdb_value*>(&local_30,(Detail *)this->m_lhs,in_RDX);
  std::operator<<((ostream *)os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }